

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

int smf_seek_to_event(smf_t *smf,smf_event_t *target)

{
  smf_event_t *psVar1;
  smf_event_t *event;
  smf_event_t *target_local;
  smf_t *smf_local;
  
  smf_rewind(smf);
  while( true ) {
    psVar1 = smf_peek_next_event(smf);
    if (psVar1 == (smf_event_t *)0x0) {
      __assert_fail("event",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x3af,"int smf_seek_to_event(smf_t *, const smf_event_t *)");
    }
    if (psVar1 == target) break;
    smf_skip_next_event(smf);
  }
  smf->last_seek_position = psVar1->time_seconds;
  return 0;
}

Assistant:

int
smf_seek_to_event(smf_t *smf, const smf_event_t *target)
{
	smf_event_t *event;

	smf_rewind(smf);

#if 0
	g_debug("Seeking to event %d, track %d.", target->event_number, target->track->track_number);
#endif

	for (;;) {
		event = smf_peek_next_event(smf);

		/* There can't be NULL here, unless "target" is not in this smf. */
		assert(event);

		if (event != target)
			smf_skip_next_event(smf);
		else
			break;
	}	

	smf->last_seek_position = event->time_seconds;

	return (0);
}